

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

int Abc_NtkCollectPiPos_int(Abc_Obj_t *pBox,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  Abc_NtkIncrementTravId(pNtk);
  for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar3);
    Abc_NodeSetTravIdCurrent((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray]);
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    for (lVar5 = 0; lVar5 < (pBox->vFanins).nSize; lVar5 = lVar5 + 1) {
      Vec_PtrPush(vLiMaps,pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar5]]);
    }
    for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar3);
      Vec_PtrPush(vLoMaps,pAVar2);
    }
  }
  iVar3 = 0;
  for (iVar4 = 0; iVar1 = pNtk->vPos->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar4);
    iVar1 = Abc_NtkCollectPiPos_rec
                      ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],vLiMaps,
                       vLoMaps);
    iVar3 = iVar3 + iVar1;
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar4);
      Vec_PtrPush(vLiMaps,pAVar2);
      iVar1 = pNtk->vPos->nSize;
    }
    for (lVar5 = 0; lVar5 < (pBox->vFanouts).nSize; lVar5 = lVar5 + 1) {
      Vec_PtrPush(vLoMaps,pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar5]]);
    }
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    Abc_Obj_t * pObj; 
    int i, Counter = 0;
    // mark primary inputs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
    // add primary inputs
    if ( pBox )
    {
        Abc_ObjForEachFanin( pBox, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_NtkForEachPi( pNtk, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
    }
    // visit primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pObj), vLiMaps, vLoMaps );
    // add primary outputs
    if ( pBox )
    {
        Abc_NtkForEachPo( pNtk, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_ObjForEachFanout( pBox, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
        Counter++;
    }
    return Counter;
}